

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O3

void icu_63::set32x64Bits(uint32_t *table,int32_t start,int32_t limit)

{
  uint *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  
  iVar10 = start >> 6;
  uVar11 = 1 << ((byte)iVar10 & 0x1f);
  uVar6 = start & 0x3f;
  uVar7 = (ulong)uVar6;
  if (start + 1 != limit) {
    iVar5 = limit >> 6;
    uVar9 = limit & 0x3f;
    if (iVar10 == iVar5) {
      if (uVar6 < uVar9) {
        do {
          table[uVar7] = table[uVar7] | uVar11;
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
    }
    else {
      if (uVar6 != 0) {
        do {
          table[uVar7] = table[uVar7] | uVar11;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x40);
        iVar10 = iVar10 + 1;
      }
      if (iVar10 < iVar5) {
        uVar6 = ~(-1 << ((byte)iVar5 & 0x1f));
        if (0x1f < iVar5) {
          uVar6 = 0xffffffff;
        }
        uVar6 = (uVar6 >> ((byte)iVar10 & 0x1f)) << ((byte)iVar10 & 0x1f);
        lVar8 = 0;
        do {
          puVar1 = table + lVar8;
          uVar11 = puVar1[1];
          uVar3 = puVar1[2];
          uVar4 = puVar1[3];
          puVar2 = table + lVar8;
          *puVar2 = *puVar1 | uVar6;
          puVar2[1] = uVar11 | uVar6;
          puVar2[2] = uVar3 | uVar6;
          puVar2[3] = uVar4 | uVar6;
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x40);
      }
      uVar6 = 0x80000000;
      if (iVar5 != 0x20) {
        uVar6 = 1 << ((byte)iVar5 & 0x1f);
      }
      if (uVar9 != 0) {
        uVar7 = 0;
        do {
          table[uVar7] = table[uVar7] | uVar6;
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
    }
    return;
  }
  table[uVar7] = table[uVar7] | uVar11;
  return;
}

Assistant:

static void set32x64Bits(uint32_t table[64], int32_t start, int32_t limit) {
    U_ASSERT(start<limit);
    U_ASSERT(limit<=0x800);

    int32_t lead=start>>6;  // Named for UTF-8 2-byte lead byte with upper 5 bits.
    int32_t trail=start&0x3f;  // Named for UTF-8 2-byte trail byte with lower 6 bits.

    // Set one bit indicating an all-one block.
    uint32_t bits=(uint32_t)1<<lead;
    if((start+1)==limit) {  // Single-character shortcut.
        table[trail]|=bits;
        return;
    }

    int32_t limitLead=limit>>6;
    int32_t limitTrail=limit&0x3f;

    if(lead==limitLead) {
        // Partial vertical bit column.
        while(trail<limitTrail) {
            table[trail++]|=bits;
        }
    } else {
        // Partial vertical bit column,
        // followed by a bit rectangle,
        // followed by another partial vertical bit column.
        if(trail>0) {
            do {
                table[trail++]|=bits;
            } while(trail<64);
            ++lead;
        }
        if(lead<limitLead) {
            bits=~(((unsigned)1<<lead)-1);
            if(limitLead<0x20) {
                bits&=((unsigned)1<<limitLead)-1;
            }
            for(trail=0; trail<64; ++trail) {
                table[trail]|=bits;
            }
        }
        // limit<=0x800. If limit==0x800 then limitLead=32 and limitTrail=0.
        // In that case, bits=1<<limitLead is undefined but the bits value
        // is not used because trail<limitTrail is already false.
        bits=(uint32_t)1<<((limitLead == 0x20) ? (limitLead - 1) : limitLead);
        for(trail=0; trail<limitTrail; ++trail) {
            table[trail]|=bits;
        }
    }
}